

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitAtomicWait
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,AtomicWait *curr)

{
  Name memoryName;
  Name memory;
  Type this_00;
  char cVar1;
  Index bytes;
  Address memorySize;
  Literal *pLVar2;
  Address addr;
  long lVar3;
  anon_union_16_6_1532cd5a_for_Literal_0 *value;
  undefined1 local_190 [8];
  Flow ptr;
  Flow expected;
  Flow timeout;
  anon_union_16_6_1532cd5a_for_Literal_0 local_a0;
  undefined8 local_90;
  Literal local_88;
  undefined1 local_70 [8];
  Literal loaded;
  MemoryInstanceInfo info;
  
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_190,&this->super_ExpressionRunner<wasm::ModuleRunner>,
             *(Expression **)(curr + 0x18));
  if (ptr.breakTo.super_IString.str._M_len == 0) {
    ExpressionRunner<wasm::ModuleRunner>::visit
              ((Flow *)&ptr.breakTo.super_IString.str._M_str,
               &this->super_ExpressionRunner<wasm::ModuleRunner>,*(Expression **)(curr + 0x20));
    if (expected.breakTo.super_IString.str._M_len == 0) {
      ExpressionRunner<wasm::ModuleRunner>::visit
                ((Flow *)&expected.breakTo.super_IString.str._M_str,
                 &this->super_ExpressionRunner<wasm::ModuleRunner>,*(Expression **)(curr + 0x28));
      if (timeout.breakTo.super_IString.str._M_len == 0) {
        bytes = wasm::Type::getByteSize();
        getMemoryInstanceInfo
                  ((MemoryInstanceInfo *)&loaded.type,this,(Name)*(string_view *)(curr + 0x38));
        memory.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
        memory.super_IString.str._M_len = (size_t)info.instance;
        memorySize = getMemorySize((ModuleRunnerBase<wasm::ModuleRunner> *)loaded.type.id,memory);
        this_00 = loaded.type;
        pLVar2 = Flow::getSingleValue((Flow *)local_190);
        wasm::Literal::Literal(&local_88,pLVar2);
        addr = getFinalAddress<wasm::AtomicWait>
                         ((ModuleRunnerBase<wasm::ModuleRunner> *)this_00.id,curr,&local_88,bytes,
                          memorySize);
        wasm::Literal::~Literal(&local_88);
        memoryName.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
        memoryName.super_IString.str._M_len = (size_t)info.instance;
        doAtomicLoad((Literal *)local_70,(ModuleRunnerBase<wasm::ModuleRunner> *)loaded.type.id,addr
                     ,bytes,(Type)*(uintptr_t *)(curr + 0x30),memoryName,memorySize);
        pLVar2 = Flow::getSingleValue((Flow *)&ptr.breakTo.super_IString.str._M_str);
        cVar1 = wasm::Literal::operator!=((Literal *)local_70,pLVar2);
        if (cVar1 == '\0') {
          Flow::getSingleValue((Flow *)&expected.breakTo.super_IString.str._M_str);
          lVar3 = wasm::Literal::getInteger();
          if (lVar3 != 0) {
            (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[3])
                      (this,"threads support");
          }
          value = &local_a0;
          local_a0.i32 = 2;
          local_90 = 2;
          Flow::Flow(__return_storage_ptr__,(Literal *)&value->func);
        }
        else {
          value = (anon_union_16_6_1532cd5a_for_Literal_0 *)
                  &timeout.breakTo.super_IString.str._M_str;
          timeout.breakTo.super_IString.str._M_str._0_4_ = 1;
          Flow::Flow(__return_storage_ptr__,(Literal *)&value->func);
        }
        wasm::Literal::~Literal((Literal *)&value->func);
        wasm::Literal::~Literal((Literal *)local_70);
      }
      else {
        Flow::Flow(__return_storage_ptr__,(Flow *)&expected.breakTo.super_IString.str._M_str);
      }
      SmallVector<wasm::Literal,_1UL>::~SmallVector
                ((SmallVector<wasm::Literal,_1UL> *)&expected.breakTo.super_IString.str._M_str);
    }
    else {
      Flow::Flow(__return_storage_ptr__,(Flow *)&ptr.breakTo.super_IString.str._M_str);
    }
    SmallVector<wasm::Literal,_1UL>::~SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)&ptr.breakTo.super_IString.str._M_str);
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_190);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_190);
  return __return_storage_ptr__;
}

Assistant:

Flow visitAtomicWait(AtomicWait* curr) {
    NOTE_ENTER("AtomicWait");
    Flow ptr = self()->visit(curr->ptr);
    if (ptr.breaking()) {
      return ptr;
    }
    NOTE_EVAL1(ptr);
    auto expected = self()->visit(curr->expected);
    NOTE_EVAL1(expected);
    if (expected.breaking()) {
      return expected;
    }
    auto timeout = self()->visit(curr->timeout);
    NOTE_EVAL1(timeout);
    if (timeout.breaking()) {
      return timeout;
    }
    auto bytes = curr->expectedType.getByteSize();
    auto info = getMemoryInstanceInfo(curr->memory);
    auto memorySize = info.instance->getMemorySize(info.name);
    auto addr = info.instance->getFinalAddress(
      curr, ptr.getSingleValue(), bytes, memorySize);
    auto loaded = info.instance->doAtomicLoad(
      addr, bytes, curr->expectedType, info.name, memorySize);
    NOTE_EVAL1(loaded);
    if (loaded != expected.getSingleValue()) {
      return Literal(int32_t(1)); // not equal
    }
    // TODO: Add threads support. For now, report a host limit here, as there
    //       are no other threads that can wake us up. Without such threads,
    //       we'd hang if there is no timeout, and even if there is a timeout
    //       then we can hang for a long time if it is in a loop. The only
    //       timeout value we allow here for now is 0.
    if (timeout.getSingleValue().getInteger() != 0) {
      hostLimit("threads support");
    }
    return Literal(int32_t(2)); // Timed out
  }